

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_generators.cpp
# Opt level: O1

Vector3d * opengv::addNoise(Vector3d *__return_storage_ptr__,double noiseLevel,Vector3d *cleanPoint)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  int iVar10;
  ActualDstType actualDst;
  type lhs;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar24;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dStack_60;
  double local_48;
  double dStack_40;
  
  auVar13 = *(undefined1 (*) [16])
             (cleanPoint->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array;
  auVar1._8_8_ = 0x7fffffffffffffff;
  auVar1._0_8_ = 0x7fffffffffffffff;
  auVar11 = vandpd_avx512vl(auVar13,auVar1);
  auVar1 = vshufps_avx(auVar11,auVar11,0x4e);
  dVar24 = auVar11._0_8_;
  dVar17 = auVar1._0_8_;
  auVar1 = vshufpd_avx(auVar13,auVar13,1);
  if ((dVar24 <= dVar17) ||
     (auVar12._8_8_ = 0,
     auVar12._0_8_ =
          (cleanPoint->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[2], auVar11._8_8_ = 0x7fffffffffffffff, auVar11._0_8_ = 0x7fffffffffffffff,
     auVar11 = vandpd_avx512vl(auVar12,auVar11), dVar24 <= auVar11._0_8_)) {
    if (dVar24 < dVar17) {
      auVar14._8_8_ = 0;
      auVar14._0_8_ =
           (cleanPoint->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[2];
      auVar2._8_8_ = 0x7fffffffffffffff;
      auVar2._0_8_ = 0x7fffffffffffffff;
      auVar11 = vandpd_avx512vl(auVar14,auVar2);
      if (auVar11._0_8_ < dVar17) {
        auVar7._8_8_ = 0x8000000000000000;
        auVar7._0_8_ = 0x8000000000000000;
        auVar11 = vxorpd_avx512vl(auVar14,auVar7);
        auVar19._0_8_ = auVar11._0_8_ / auVar1._0_8_;
        auVar19._8_8_ = auVar11._8_8_;
        auVar25 = vunpcklpd_avx(ZEXT816(0),auVar19);
        auVar18 = ZEXT816(0x3ff0000000000000);
        goto LAB_001f73db;
      }
    }
    auVar8._8_8_ = 0x8000000000000000;
    auVar8._0_8_ = 0x8000000000000000;
    auVar11 = vxorpd_avx512vl(auVar13,auVar8);
    auVar18._0_8_ =
         auVar11._0_8_ /
         (cleanPoint->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
         .array[2];
    auVar18._8_8_ = auVar11._8_8_;
    auVar25 = ZEXT816(0x3ff0000000000000);
  }
  else {
    auVar3._8_8_ = 0x8000000000000000;
    auVar3._0_8_ = 0x8000000000000000;
    auVar11 = vxorpd_avx512vl(auVar1,auVar3);
    auVar25._8_8_ = 0x3ff0000000000000;
    auVar25._0_8_ = auVar11._0_8_ / auVar13._0_8_;
    auVar18 = SUB6416(ZEXT864(0),0) << 0x40;
  }
LAB_001f73db:
  dVar17 = auVar18._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar17 * dVar17 + auVar25._0_8_ * auVar25._0_8_ + auVar25._8_8_ * auVar25._8_8_;
  auVar11 = vsqrtpd_avx(auVar27);
  dVar24 = auVar11._0_8_;
  auVar29._8_8_ = dVar24;
  auVar29._0_8_ = dVar24;
  auVar11 = vdivpd_avx(auVar25,auVar29);
  auVar30._0_8_ = dVar17 / dVar24;
  auVar30._8_8_ = auVar18._8_8_;
  dVar17 = (cleanPoint->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[2];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar17;
  auVar12 = vshufpd_avx(auVar11,auVar11,1);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = auVar12._0_8_ * dVar17;
  auVar2 = vfmsub231sd_fma(auVar28,auVar1,auVar30);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = auVar30._0_8_ * auVar13._0_8_;
  auVar14 = vfmsub231sd_fma(auVar31,auVar11,auVar20);
  auVar2 = vunpcklpd_avx(auVar2,auVar14);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = auVar11._0_8_ * auVar1._0_8_;
  auVar1 = vfmsub231sd_fma(auVar16,auVar13,auVar12);
  uVar9 = rand();
  iVar10 = rand();
  auVar13._8_8_ = 0x4089000000000000;
  auVar13._0_8_ = 0x4089000000000000;
  auVar12 = vmulpd_avx512vl(*(undefined1 (*) [16])
                             (cleanPoint->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                             .m_data.array,auVar13);
  auVar13 = vpinsrd_avx(ZEXT416(uVar9),iVar10,1);
  auVar13 = vcvtdq2pd_avx(auVar13);
  auVar4._8_8_ = 0x41dfffffffc00000;
  auVar4._0_8_ = 0x41dfffffffc00000;
  auVar13 = vdivpd_avx512vl(auVar13,auVar4);
  auVar5._8_8_ = 0xbfe0000000000000;
  auVar5._0_8_ = 0xbfe0000000000000;
  auVar13 = vaddpd_avx512vl(auVar13,auVar5);
  dVar17 = auVar13._0_8_ * noiseLevel;
  dVar24 = auVar13._8_8_ * noiseLevel;
  auVar21._0_8_ = dVar17 + dVar17;
  auVar21._8_8_ = dVar24 + dVar24;
  auVar6._8_8_ = 0x3ff6a0902de00d1b;
  auVar6._0_8_ = 0x3ff6a0902de00d1b;
  auVar14 = vdivpd_avx512vl(auVar21,auVar6);
  dVar17 = auVar14._0_8_;
  dStack_60 = auVar11._8_8_;
  auVar13 = vshufpd_avx(auVar14,auVar14,3);
  local_48 = auVar2._0_8_;
  dStack_40 = auVar2._8_8_;
  auVar15._0_8_ = auVar12._0_8_ + dVar17 * auVar11._0_8_ + auVar13._0_8_ * local_48;
  auVar15._8_8_ = auVar12._8_8_ + dVar17 * dStack_60 + auVar13._8_8_ * dStack_40;
  auVar13 = vunpcklpd_avx(auVar30,auVar1);
  auVar22._0_8_ = dVar17 * auVar13._0_8_;
  auVar22._8_8_ = auVar14._8_8_ * auVar13._8_8_;
  auVar13 = vshufpd_avx(auVar22,auVar22,1);
  dVar17 = (cleanPoint->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[2] * 800.0 + auVar22._0_8_ + auVar13._0_8_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar17 * dVar17 + auVar15._0_8_ * auVar15._0_8_ + auVar15._8_8_ * auVar15._8_8_;
  auVar13 = vsqrtpd_avx(auVar23);
  dVar24 = auVar13._0_8_;
  auVar26._8_8_ = dVar24;
  auVar26._0_8_ = dVar24;
  auVar13 = vdivpd_avx(auVar15,auVar26);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
   m_data.array = auVar13;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = dVar17 / dVar24;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3d
opengv::addNoise( double noiseLevel, Eigen::Vector3d cleanPoint )
{
  //compute a vector in the normal plane (based on good conditioning)
  Eigen::Vector3d normalVector1;
  if(
      (fabs(cleanPoint[0]) > fabs(cleanPoint[1])) &&
      (fabs(cleanPoint[0]) > fabs(cleanPoint[2])) )
  {
    normalVector1[1] = 1.0;
    normalVector1[2] = 0.0;
    normalVector1[0] = -cleanPoint[1]/cleanPoint[0];
  }
  else
  {
    if(
        (fabs(cleanPoint[1]) > fabs(cleanPoint[0])) &&
        (fabs(cleanPoint[1]) > fabs(cleanPoint[2])) )
    {
      normalVector1[2] = 1.0;
      normalVector1[0] = 0.0;
      normalVector1[1] = -cleanPoint[2]/cleanPoint[1];
    }
    else
    {
      normalVector1[0] = 1.0;
      normalVector1[1] = 0.0;
      normalVector1[2] = -cleanPoint[0]/cleanPoint[2];
    }
  }

  normalVector1 = normalVector1 / normalVector1.norm();
  Eigen::Vector3d normalVector2 = cleanPoint.cross(normalVector1);
  double noiseX =
      noiseLevel * (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0 / 1.4142;
  double noiseY =
      noiseLevel * (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0 / 1.4142;

  Eigen::Vector3d noisyPoint =
      800 * cleanPoint + noiseX *normalVector1 + noiseY * normalVector2;
  noisyPoint = noisyPoint / noisyPoint.norm();
  return noisyPoint;

}